

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFusage.c
# Opt level: O0

uint64_t dissect_and_calculate(NF_list *nl)

{
  ushort uVar1;
  NF_link_map *pNVar2;
  long lVar3;
  Elf64_Xword EVar4;
  char *pcVar5;
  int iVar6;
  Elf64_Dyn *__buf;
  char **ppcVar7;
  NF_link_map **ppNVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  void *pvVar13;
  char *real_name;
  Elf64_Addr maplength;
  Elf64_Ehdr *ehdr;
  size_t retlen;
  filebuf fb;
  NF_list *tmp_1;
  char *ptr_1;
  int i_1;
  char *ptr;
  char local_118 [4];
  int i;
  char buf [128];
  int fd;
  int found;
  NF_list *tmp;
  char *filename;
  Elf64_Addr offset;
  char *tmp_name;
  int neededcnt;
  int runpcnt;
  int nneeded;
  int nrunp;
  Elf64_Dyn *curr;
  Elf64_Dyn *dyn;
  Elf64_Dyn *str;
  Elf64_Phdr *ph;
  Elf64_Addr mapend;
  Elf64_Addr mapstart;
  Elf64_Dyn *ld;
  uint16_t phnum;
  Elf64_Phdr *phdr;
  NF_link_map *l;
  NF_list *nl_local;
  
  pNVar2 = nl->map;
  __buf = (Elf64_Dyn *)malloc(pNVar2->l_phlen);
  pread(nl->fd,__buf,pNVar2->l_phlen,pNVar2->l_phoff);
  uVar1 = pNVar2->l_phnum;
  for (str = __buf; str < (Elf64_Dyn *)((long)__buf + (ulong)uVar1 * 0x38);
      str = (Elf64_Dyn *)&str[3].d_un) {
    if ((int)str->d_tag == 1) {
      ph = (Elf64_Phdr *)(str[1].d_tag + str[2].d_un.d_val);
    }
    else if ((int)str->d_tag == 2) {
      mapstart = (Elf64_Addr)malloc(str[2].d_un.d_val);
      pread(nl->fd,(void *)mapstart,str[2].d_un.d_val,(str->d_un).d_val);
    }
  }
  curr = (Elf64_Dyn *)mapstart;
  runpcnt = 0;
  neededcnt = 0;
  for (_nneeded = (Elf64_Dyn *)mapstart; _nneeded->d_tag != 0; _nneeded = _nneeded + 1) {
    lVar3 = _nneeded->d_tag;
    if (lVar3 == 1) {
      neededcnt = neededcnt + 1;
    }
    else if (lVar3 == 5) {
      dyn = _nneeded;
    }
    else if (lVar3 == 0x1d) {
      runpcnt = runpcnt + 1;
    }
  }
  ppcVar7 = (char **)malloc((long)runpcnt << 3);
  pNVar2->l_runpath = ppcVar7;
  ppNVar8 = (NF_link_map **)calloc((long)(neededcnt + 2),8);
  pNVar2->l_search_list = ppNVar8;
  tmp_name._4_4_ = 0;
  tmp_name._0_4_ = 0;
  for (; curr->d_tag != 0; curr = curr + 1) {
    if (curr->d_tag == 0x1d) {
      pcVar9 = (char *)malloc(0x40);
      pread(nl->fd,pcVar9,0x40,(dyn->d_un).d_val + (curr->d_un).d_val);
      pNVar2->l_runpath[tmp_name._4_4_] = pcVar9;
      tmp_name._4_4_ = tmp_name._4_4_ + 1;
    }
  }
  curr = (Elf64_Dyn *)mapstart;
  do {
    if (curr->d_tag == 0) {
      pNVar2->l_search_list[(int)tmp_name] = pNVar2;
      nl->len = (ulong)&ph[0x49].p_offset & 0xfffffffffffff000;
      return (ulong)&ph[0x49].p_offset & 0xfffffffffffff000;
    }
    if (curr->d_tag == 1) {
      tmp_name._0_4_ = 0;
      EVar4 = (curr->d_un).d_val;
      pcVar9 = (char *)malloc(0x80);
      pread(nl->fd,pcVar9,0x80,(dyn->d_un).d_val + EVar4);
      buf[0x7c] = '\0';
      buf[0x7d] = '\0';
      buf[0x7e] = '\0';
      buf[0x7f] = '\0';
      for (_fd = head; _fd != (NF_list *)0x0; _fd = _fd->next) {
        iVar6 = strcmp(pcVar9,_fd->map->l_name);
        if (iVar6 == 0) {
          buf[0x7c] = '\x01';
          buf[0x7d] = '\0';
          buf[0x7e] = '\0';
          buf[0x7f] = '\0';
          tmp_name._0_4_ = 1;
          *nl->map->l_search_list = _fd->map;
          break;
        }
      }
      if (buf._124_4_ == 0) {
        buf._120_4_ = open(pcVar9,0);
        if (buf._120_4_ == -1) {
          for (ptr._4_4_ = 0; ptr._4_4_ < tmp_name._4_4_; ptr._4_4_ = ptr._4_4_ + 1) {
            pcVar5 = pNVar2->l_runpath[ptr._4_4_];
            sVar10 = strlen(pNVar2->l_runpath[ptr._4_4_]);
            memcpy(local_118,pcVar5,sVar10);
            local_118[sVar10] = '/';
            sVar11 = strlen(pcVar9);
            memcpy(local_118 + sVar10 + 1,pcVar9,sVar11 + 1);
            buf._120_4_ = open(local_118,0);
            if (buf._120_4_ != -1) break;
          }
          if (buf._120_4_ == -1) {
            for (ptr_1._4_4_ = 0; ptr_1._4_4_ < 2; ptr_1._4_4_ = ptr_1._4_4_ + 1) {
              pcVar5 = sys_path[ptr_1._4_4_];
              sVar10 = strlen(sys_path[ptr_1._4_4_]);
              memcpy(local_118,pcVar5,sVar10);
              sVar11 = strlen(pcVar9);
              memcpy(local_118 + sVar10,pcVar9,sVar11 + 1);
              buf._120_4_ = open(local_118,0);
              if (buf._120_4_ != -1) break;
            }
            if (buf._120_4_ == -1) {
              printf("In mapping %s as a dependency: file not found\n",pcVar9);
            }
          }
        }
        fb.buf._824_8_ = calloc(0x20,1);
        tail->next = (NF_list *)fb.buf._824_8_;
        ((NF_list *)fb.buf._824_8_)->next = (NF_list *)0x0;
        tail = (NF_list *)fb.buf._824_8_;
        read(buf._120_4_,&fb,0x340);
        uVar12 = (ulong)(ushort)fb.buf._48_2_;
        pvVar13 = calloc(0x298,1);
        *(void **)fb.buf._824_8_ = pvVar13;
        *(undefined4 *)(fb.buf._824_8_ + 0x14) = buf._120_4_;
        pcVar9 = strdup(pcVar9);
        *(char **)(*(long *)fb.buf._824_8_ + 8) = pcVar9;
        *(undefined2 *)(*(long *)fb.buf._824_8_ + 0x38) = fb.buf._48_2_;
        *(ulong *)(*(long *)fb.buf._824_8_ + 0x40) = uVar12 * 0x38;
        *(undefined8 *)(*(long *)fb.buf._824_8_ + 0x48) = fb.buf._24_8_;
        pNVar2->l_search_list[(int)tmp_name] = *(NF_link_map **)fb.buf._824_8_;
        tmp_name._0_4_ = (int)tmp_name + 1;
      }
    }
    curr = curr + 1;
  } while( true );
}

Assistant:

uint64_t dissect_and_calculate(struct NF_list *nl)
{
    /* this function examine ``nl`` on the list, and put its dependencies on the list */
    //fb.buf is used as a pointer to ELF header, later we will do this again in building up the link_map
    struct NF_link_map *l = nl->map;
    Elf64_Phdr *phdr = malloc(l->l_phlen);
    pread(nl->fd, (void *)phdr, l->l_phlen, l->l_phoff);
    uint16_t phnum = l->l_phnum;

    Elf64_Dyn *ld;
    Elf64_Addr mapstart = -1, mapend;

    /* now dealing with the program headers, from which we need to 
       access the PT_LOAD for memory it takes up, and 
       PT_DYNAMIC for the contents of .dynamic */
    for (Elf64_Phdr *ph = phdr; ph < &phdr[phnum]; ++ph)
    {
        if (ph->p_type == PT_LOAD)
        {
            if (mapstart < 0)
                mapstart = ALIGN_DOWN(ph->p_vaddr, 4096);
            mapend = ph->p_vaddr + ph->p_memsz;
        }
        else if (ph->p_type == PT_DYNAMIC)
        {
            ld = malloc(ph->p_memsz);
            /* though it is not the same time, but it is the same fd... */
            pread(nl->fd, (void *)ld, ph->p_memsz, ph->p_offset); //note that offset and paddr are not the same
        }
    }

    Elf64_Dyn *str, *dyn = ld, *curr = ld;
    int nrunp = 0, nneeded = 0;

    while (curr->d_tag != DT_NULL)
    {
        switch (curr->d_tag)
        {
        case DT_STRTAB:
            str = curr;
            break;
        case DT_NEEDED:
            nneeded++;
            break;
        case DT_RUNPATH:
            nrunp++;
            break;
        }
        curr++;
    }
    l->l_runpath = (const char **)malloc(nrunp * sizeof(char *));
    l->l_search_list = (struct NF_link_map **)calloc(nneeded + 2, sizeof(struct NF_link_map *));
    int runpcnt = 0;
    int neededcnt = 0; //again, this is for filling the search list

    while (dyn->d_tag != DT_NULL)
    {
        if (dyn->d_tag == DT_RUNPATH)
        {
            char *tmp_name = malloc(64);
            pread(nl->fd, tmp_name, 64, str->d_un.d_ptr + dyn->d_un.d_val);
            l->l_runpath[runpcnt] = tmp_name;
            runpcnt++;
        }
        dyn++;
    }

    dyn = ld;
    while (dyn->d_tag != DT_NULL)
    {
        if (dyn->d_tag == DT_NEEDED)
        {
            neededcnt = 0; //neededcnt is DT_NEEDED-wise
            Elf64_Addr offset = dyn->d_un.d_val;
            char *filename = malloc(128);                           //store the filename for each dependency
            pread(nl->fd, filename, 128, str->d_un.d_ptr + offset); //change from 64 to 128 because the prefix is long
            struct NF_list *tmp = head;
            int found = 0;
            while (tmp != NULL)
            {
                if (!strcmp(filename, tmp->map->l_name))
                {
                    found = 1;
                    nl->map->l_search_list[neededcnt++] = tmp->map;
                    break;
                }
                tmp = tmp->next;
            }
            if (!found)
            {
                int fd = open(filename, O_RDONLY);
                /* XXX problems here
                 * open will successfully deal with file under the current directory
                 * but dlopen won't until RUNPATH is set
                 */
                if (fd == -1)
                {
                    //XXX: THIS IS NOT REALLY USEABLE NOW, PLZ ADD RUNPATH SUPPORT
                    //only lib1.so -> lib2.so -> lib3.so will work now ... and no libc func can be used

                    char buf[128];
                    for (int i = 0; i < runpcnt; i++)
                    {
                        char *ptr = mempcpy(buf, l->l_runpath[i], strlen(l->l_runpath[i]));
                        *ptr = '/'; //add a "/" to make it a path
                        ptr++;
                        memcpy(ptr, filename, strlen(filename) + 1); //+1 to copy \0. memcpy only copy num bytes
                        if ((fd = open(buf, O_RDONLY)) != -1)
                            break;
                    }
                    //nothing found in runpath, now try system path
                    if (fd == -1)
                    {
                        for (int i = 0; i < 2; i++)
                        {
                            char *ptr = mempcpy(buf, sys_path[i], strlen(sys_path[i]));
                            memcpy(ptr, filename, strlen(filename) + 1);
                            if ((fd = open(buf, O_RDONLY)) != -1)
                                break;
                        }
                        if (fd == -1)
                            printf("In mapping %s as a dependency: file not found\n", filename);
                    }
                }
                struct NF_list *tmp = calloc(sizeof(struct NF_list), 1);
                //reset the pointers to fit a new element
                tail->next = tmp;
                tmp->next = NULL;
                tail = tmp; //set tail to be the last unique element
                /* filling the info all over again */
                struct filebuf fb;
                fb.len = 0;
                size_t retlen = read(fd, fb.buf, sizeof(fb.buf) - fb.len);
                Elf64_Ehdr *ehdr = (Elf64_Ehdr *)fb.buf;
                Elf64_Addr maplength = ehdr->e_phnum * sizeof(Elf64_Phdr);

                tmp->map = calloc(sizeof(struct NF_link_map), 1);
                tmp->fd = fd;
                char *real_name = strdup(filename); //don't forget to free it when destroying a link_map!
                tmp->map->l_name = real_name;
                tmp->map->l_phnum = ehdr->e_phnum;
                tmp->map->l_phlen = maplength;
                tmp->map->l_phoff = ehdr->e_phoff;
                l->l_search_list[neededcnt++] = tmp->map;
            }
        }
        dyn++;
    }
    l->l_search_list[neededcnt] = l; //quick fix for global variables to relocate

    nl->len = ALIGN_UP(mapend - mapstart, 4096); //use this to get the exact location for next so if we want it compact
    return ALIGN_UP(mapend - mapstart, 4096);
}